

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

ON_SHA1_Hash *
ON_SHA1_Hash::FileSystemPathHash
          (ON_SHA1_Hash *__return_storage_ptr__,wchar_t *path,bool bIgnoreCase)

{
  ON_wString local_28;
  ON_wString clean_path;
  
  ON_FileSystemPath::CleanPath((ON_FileSystemPath *)&local_28,false,false,true,false,L'/',path);
  ON_wString::MapStringOrdinal(&clean_path,(ON_StringMapOrdinalType)(ON_FileSystemPath *)&local_28);
  ON_wString::~ON_wString(&local_28);
  StringHash(__return_storage_ptr__,&clean_path,(ON__UINT64 *)&local_28);
  ON_wString::~ON_wString(&clean_path);
  return __return_storage_ptr__;
}

Assistant:

ON_SHA1_Hash ON_SHA1_Hash::FileSystemPathHash(
  const wchar_t* path,
  bool bIgnoreCase
  )
{
  const bool bTrimLeft = false;
  const bool bTrimRight = false;
  const bool bAllowWindowsUNCHostNameOrDiskLetter = true;
  const bool bDeleteWindowsUNCHostNameOrDiskLetter = false;
  const wchar_t directory_separator = ON_wString::Slash;
  const ON_StringMapOrdinalType string_map
    = bIgnoreCase
    ? ON_StringMapOrdinalType::MinimumOrdinal
    : ON_StringMapOrdinalType::Identity;

  const ON_wString clean_path = ON_FileSystemPath::CleanPath(
    bTrimLeft,
    bTrimRight,
    bAllowWindowsUNCHostNameOrDiskLetter,
    bDeleteWindowsUNCHostNameOrDiskLetter,
    directory_separator,
    path
    ).MapStringOrdinal(string_map);

  ON__UINT64 byte_count = 0;
  return ON_SHA1_Hash::StringHash( clean_path, byte_count );
}